

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DnsStats.cpp
# Opt level: O3

bool DnsStats::IsIpv4Name(uint8_t *name,size_t name_length)

{
  bool bVar1;
  int iVar2;
  bool bVar3;
  int iVar4;
  size_t i;
  int iVar5;
  int iVar6;
  byte bVar7;
  int iVar8;
  bool bVar9;
  
  bVar1 = false;
  if (name_length != 0) {
    bVar3 = true;
    iVar4 = 0;
    do {
      if (bVar3) {
        iVar6 = 1;
        iVar5 = 0;
        do {
          name_length = name_length - 1;
          bVar7 = name[name_length];
          if (9 < (byte)(bVar7 - 0x30)) {
            bVar9 = bVar7 == 0x2e;
            goto LAB_0015c4f5;
          }
          iVar8 = (bVar7 - 0x30) * iVar6;
          iVar2 = iVar6 * 10;
          if (999 < iVar6) {
            iVar8 = 0;
            iVar2 = iVar6;
            bVar3 = bVar1;
          }
          iVar6 = iVar2;
          iVar5 = iVar5 + iVar8;
        } while ((name_length != 0) && (bVar3 != false));
        if (bVar3 != false) {
          bVar9 = false;
LAB_0015c4f5:
          bVar7 = (name_length == 0 | bVar9) & iVar5 < 0x100;
          iVar4 = iVar4 + (uint)bVar7;
          if (bVar7 == 0) {
            bVar3 = bVar1;
          }
        }
      }
    } while (((name_length != 0) && (bVar3 != false)) && (iVar4 < 4));
    bVar1 = (bool)(iVar4 == 4 & bVar3);
  }
  return bVar1;
}

Assistant:

bool DnsStats::IsIpv4Name(const uint8_t * name, size_t name_length)
{
    int nb_num_dot = 0;
    size_t i;
    bool is_ipv4 = true;

    i = name_length;
    while (i > 0 && is_ipv4 && nb_num_dot < 4) {
        int mult = 1;
        int r = 0;
        int c = 0;

        while (is_ipv4 && i > 0) {
            i--;
            c = name[i];
            if (c >= '0' && c <= '9') {
                if (mult < 1000) {
                    r += mult * (c - '0');
                    mult *= 10;
                }
                else {
                    is_ipv4 = false;
                }
            }
            else {
                break;
            }
        }

        if (is_ipv4) {
            if ((i == 0 || c == '.') && r < 256) {
                nb_num_dot++;
            }
            else {
                is_ipv4 = false;
            }
        }
    }

    is_ipv4 &= (nb_num_dot == 4);

    return is_ipv4;
}